

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::IdlNamer::LegacyRustUnionTypeOffsetName_abi_cxx11_
          (string *__return_storage_ptr__,IdlNamer *this,FieldDef *field)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  FieldDef *local_20;
  FieldDef *field_local;
  IdlNamer *this_local;
  
  local_20 = field;
  field_local = (FieldDef *)this;
  this_local = (IdlNamer *)__return_storage_ptr__;
  std::operator+(&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field,"_type")
  ;
  (*(this->super_Namer)._vptr_Namer[0xe])(&local_60,this,&local_80);
  ConvertCase(&local_40,&local_60,kAllUpper,kSnake);
  std::operator+(__return_storage_ptr__,"VT_",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

std::string LegacyRustUnionTypeOffsetName(const FieldDef &field) const {
    return "VT_" + ConvertCase(EscapeKeyword(field.name + "_type"), Case::kAllUpper);
  }